

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall CProficiencies::CheckImprove(CProficiencies *this,int pindex,int chance)

{
  pointer ppVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string buffer;
  char *local_68 [2];
  char *local_58;
  char *local_48;
  char *local_38;
  
  if (((0xfffffff6 < this->profs[pindex] - 10U) && (iVar2 = number_percent(), iVar2 < 0xb)) &&
     (iVar2 = number_percent(), iVar2 < 0xb)) {
    if ((4 < this->profs[pindex]) &&
       (iVar2 = number_percent(), iVar4 = this->profs[pindex] * 6,
       iVar2 != iVar4 && SBORROW4(iVar2,iVar4) == iVar2 + this->profs[pindex] * -6 < 0)) {
      return;
    }
    iVar2 = number_percent();
    if (iVar2 <= chance) {
      this->profs[pindex] = this->profs[pindex] + 1;
      pcVar3 = get_char_color(this->ch,"green");
      ppVar1 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar2 = this->profs[pindex];
      local_38 = END_COLOR(this->ch);
      local_58 = "improved at";
      if (iVar2 == 10) {
        local_58 = "mastered";
      }
      local_48 = ppVar1[pindex].name;
      fmt.size_ = 0xcccc;
      fmt.data_ = (char *)0x15;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_68;
      local_68[0] = pcVar3;
      ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"{}You have {} {}.{}\n\r",fmt,args);
      send_to_char(buffer._M_dataplus._M_p,this->ch);
      gain_exp(this->ch,0xfa);
      std::__cxx11::string::~string((string *)&buffer);
    }
  }
  return;
}

Assistant:

void CProficiencies::CheckImprove(int pindex, int chance) //chance is out of 10000
{
	if (profs[pindex] >= 10 || profs[pindex] < 1)
		return;

	if (number_percent() > 10)
		return;

	if (number_percent() > 10)
		return;

	if (profs[pindex] > 4)
	{
		if(number_percent() > (6 * profs[pindex]))
			return;
	}

	if (number_percent() > chance)
		return;

	profs[pindex]++;

	auto buffer = fmt::format("{}You have {} {}.{}\n\r", 
		get_char_color(ch, "green"), 
		profs[pindex] == 10 ? "mastered" : "improved at",
		prof_table[pindex].name, 
		END_COLOR(ch));
	send_to_char(buffer.c_str(), ch);

	gain_exp(ch, 250);
}